

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontAtlas::GlyphRangesBuilder::BuildRanges
          (GlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  unsigned_short *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = 0;
  do {
    bVar1 = GetBit(this,iVar4);
    iVar5 = iVar4;
    if (bVar1) {
      iVar5 = out_ranges->Capacity;
      if (out_ranges->Size == iVar5) {
        if (iVar5 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar5 / 2 + iVar5;
        }
        iVar6 = out_ranges->Size + 1;
        if (iVar6 < iVar3) {
          iVar6 = iVar3;
        }
        if (iVar5 < iVar6) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar6;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)iVar4;
      out_ranges->Size = out_ranges->Size + 1;
      iVar3 = 0x10000;
      if (0x10000 < iVar4) {
        iVar3 = iVar4;
      }
      do {
        iVar5 = iVar4;
        if (iVar3 == iVar5) break;
        bVar1 = GetBit(this,iVar5 + 1);
        iVar4 = iVar5 + 1;
      } while (bVar1);
      iVar4 = out_ranges->Capacity;
      if (out_ranges->Size == iVar4) {
        if (iVar4 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar4 / 2 + iVar4;
        }
        iVar6 = out_ranges->Size + 1;
        if (iVar6 < iVar3) {
          iVar6 = iVar3;
        }
        if (iVar4 < iVar6) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar6;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)iVar5;
      out_ranges->Size = out_ranges->Size + 1;
    }
    iVar4 = iVar5 + 1;
    if (0xfffe < iVar5) {
      iVar4 = out_ranges->Capacity;
      if (out_ranges->Size == iVar4) {
        iVar5 = out_ranges->Size + 1;
        if (iVar4 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar4 / 2 + iVar4;
        }
        if (iVar5 < iVar3) {
          iVar5 = iVar3;
        }
        if (iVar4 < iVar5) {
          puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar2;
          out_ranges->Capacity = iVar5;
        }
      }
      out_ranges->Data[out_ranges->Size] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}